

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O3

int x509v3_cache_extensions(X509 *x)

{
  CRYPTO_MUTEX *lock;
  byte bVar1;
  ASN1_INTEGER *a;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  long in_RAX;
  EVP_MD *type;
  long lVar5;
  BASIC_CONSTRAINTS *a_00;
  ASN1_BIT_STRING *a_01;
  OPENSSL_STACK *pOVar6;
  size_t sVar7;
  ASN1_OBJECT *o;
  size_t sVar8;
  ASN1_OCTET_STRING *pAVar9;
  AUTHORITY_KEYID *pAVar10;
  X509_NAME *pXVar11;
  X509_NAME *b;
  stack_st_GENERAL_NAME *psVar12;
  NAME_CONSTRAINTS *pNVar13;
  undefined8 *puVar14;
  int *piVar15;
  size_t sVar16;
  X509_EXTENSION *ex;
  int iVar17;
  undefined8 local_38;
  
  lock = &x->lock;
  local_38 = in_RAX;
  CRYPTO_MUTEX_lock_read(lock);
  uVar4 = x->ex_flags;
  CRYPTO_MUTEX_unlock_read(lock);
  if ((uVar4 >> 8 & 1) != 0) goto LAB_0029bea5;
  CRYPTO_MUTEX_lock_write(lock);
  if ((x->ex_flags & 0x100) == 0) {
    type = EVP_sha256();
    iVar3 = X509_digest((X509 *)x,type,x->cert_hash,(uint *)0x0);
    if (iVar3 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    lVar5 = X509_get_version(x);
    if (lVar5 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x40;
    }
    a_00 = (BASIC_CONSTRAINTS *)X509_get_ext_d2i((X509 *)x,0x57,(int *)&local_38,(int *)0x0);
    if (a_00 == (BASIC_CONSTRAINTS *)0x0) {
      uVar4 = 0x80;
      if ((int)local_38 != -1) goto LAB_0029bb3f;
    }
    else {
      iVar3 = a_00->ca;
      if (iVar3 != 0) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x10;
      }
      a = a_00->pathlen;
      if (a == (ASN1_INTEGER *)0x0) {
        lVar5 = -1;
      }
      else if ((iVar3 == 0) || (a->type == 0x102)) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
        lVar5 = 0;
      }
      else {
        lVar5 = ASN1_INTEGER_get(a);
      }
      x->ex_pathlen = lVar5;
      BASIC_CONSTRAINTS_free(a_00);
      uVar4 = 1;
LAB_0029bb3f:
      x->ex_flags = x->ex_flags | uVar4;
    }
    a_01 = (ASN1_BIT_STRING *)X509_get_ext_d2i((X509 *)x,0x53,(int *)&local_38,(int *)0x0);
    if (a_01 == (ASN1_BIT_STRING *)0x0) {
      if ((int)local_38 != -1) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
      }
    }
    else {
      iVar3 = a_01->length;
      if (iVar3 < 1) {
        x->ex_kusage = 0;
      }
      else {
        pbVar2 = a_01->data;
        bVar1 = *pbVar2;
        x->ex_kusage = (uint)bVar1;
        if (iVar3 != 1) {
          x->ex_kusage = (uint)CONCAT11(pbVar2[1],bVar1);
        }
      }
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 2;
      ASN1_BIT_STRING_free(a_01);
    }
    x->ex_xkusage = 0;
    pOVar6 = (OPENSSL_STACK *)X509_get_ext_d2i((X509 *)x,0x7e,(int *)&local_38,(int *)0x0);
    if (pOVar6 == (OPENSSL_STACK *)0x0) {
      if ((int)local_38 != -1) {
        *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
      }
    }
    else {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 4;
      sVar7 = OPENSSL_sk_num(pOVar6);
      if (sVar7 != 0) {
        sVar7 = 0;
        do {
          o = (ASN1_OBJECT *)OPENSSL_sk_value(pOVar6,sVar7);
          iVar3 = OBJ_obj2nid(o);
          if (0xb3 < iVar3) {
            if (iVar3 == 0xb4) {
              uVar4 = 0x20;
            }
            else if (iVar3 == 0x129) {
              uVar4 = 0x80;
            }
            else {
              if (iVar3 != 0x38e) goto switchD_0029bc0b_caseD_86;
              uVar4 = 0x100;
            }
            goto LAB_0029bc5f;
          }
          switch(iVar3) {
          case 0x81:
            uVar4 = 1;
            break;
          case 0x82:
            uVar4 = 2;
            break;
          case 0x83:
            uVar4 = 8;
            break;
          case 0x84:
            uVar4 = 4;
            break;
          case 0x85:
            uVar4 = 0x40;
            break;
          default:
            goto switchD_0029bc0b_caseD_86;
          case 0x89:
          case 0x8b:
            uVar4 = 0x10;
          }
LAB_0029bc5f:
          x->ex_xkusage = x->ex_xkusage | uVar4;
switchD_0029bc0b_caseD_86:
          sVar7 = sVar7 + 1;
          sVar8 = OPENSSL_sk_num(pOVar6);
        } while (sVar7 < sVar8);
      }
      OPENSSL_sk_pop_free_ex(pOVar6,sk_ASN1_OBJECT_call_free_func,ASN1_OBJECT_free);
    }
    pAVar9 = (ASN1_OCTET_STRING *)X509_get_ext_d2i((X509 *)x,0x52,(int *)&local_38,(int *)0x0);
    x->skid = pAVar9;
    if ((pAVar9 == (ASN1_OCTET_STRING *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pAVar10 = (AUTHORITY_KEYID *)X509_get_ext_d2i((X509 *)x,0x5a,(int *)&local_38,(int *)0x0);
    x->akid = pAVar10;
    if ((pAVar10 == (AUTHORITY_KEYID *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pXVar11 = X509_get_subject_name((X509 *)x);
    b = X509_get_issuer_name((X509 *)x);
    iVar3 = X509_NAME_cmp(pXVar11,b);
    if (iVar3 == 0) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x20;
      iVar3 = X509_check_akid((X509 *)x,(AUTHORITY_KEYID *)x->akid);
      if ((iVar3 == 0) && (((x->ex_flags & 2) == 0 || ((x->ex_kusage & 4) != 0)))) {
        x->ex_flags = x->ex_flags | 0x2000;
      }
    }
    psVar12 = (stack_st_GENERAL_NAME *)X509_get_ext_d2i((X509 *)x,0x55,(int *)&local_38,(int *)0x0);
    x->altname = psVar12;
    if ((psVar12 == (stack_st_GENERAL_NAME *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pNVar13 = (NAME_CONSTRAINTS *)X509_get_ext_d2i((X509 *)x,0x29a,(int *)&local_38,(int *)0x0);
    x->nc = pNVar13;
    if ((pNVar13 == (NAME_CONSTRAINTS *)0x0) && ((int)local_38 != -1)) {
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    pOVar6 = (OPENSSL_STACK *)
             X509_get_ext_d2i((X509 *)x,0x67,(int *)((long)&local_38 + 4),(int *)0x0);
    x->crldp = (stack_st_DIST_POINT *)pOVar6;
    if ((pOVar6 == (OPENSSL_STACK *)0x0) && (local_38._4_4_ != 0xffffffff)) {
LAB_0029bd9b:
      *(byte *)&x->ex_flags = (byte)x->ex_flags | 0x80;
    }
    else {
      sVar7 = OPENSSL_sk_num(pOVar6);
      if (sVar7 != 0) {
        sVar7 = 0;
        do {
          puVar14 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)x->crldp,sVar7);
          if (((int *)*puVar14 != (int *)0x0) && (*(int *)*puVar14 == 1)) {
            sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)puVar14[2]);
            if (sVar8 != 0) {
              sVar8 = 0;
              do {
                piVar15 = (int *)OPENSSL_sk_value((OPENSSL_STACK *)puVar14[2],sVar8);
                if (*piVar15 == 4) {
                  pXVar11 = *(X509_NAME **)(piVar15 + 2);
                  if (pXVar11 != (X509_NAME *)0x0) goto LAB_0029be20;
                  break;
                }
                sVar8 = sVar8 + 1;
                sVar16 = OPENSSL_sk_num((OPENSSL_STACK *)puVar14[2]);
              } while (sVar8 < sVar16);
            }
            pXVar11 = X509_get_issuer_name((X509 *)x);
LAB_0029be20:
            iVar3 = DIST_POINT_set_dpname((DIST_POINT_NAME *)*puVar14,pXVar11);
            if (iVar3 == 0) goto LAB_0029bd9b;
          }
          sVar7 = sVar7 + 1;
          sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)x->crldp);
        } while (sVar7 < sVar8);
      }
    }
    local_38 = (ulong)local_38._4_4_ << 0x20;
    iVar3 = X509_get_ext_count((X509 *)x);
    if (0 < iVar3) {
      do {
        ex = X509_get_ext((X509 *)x,(int)local_38);
        iVar3 = X509_EXTENSION_get_critical(ex);
        if ((iVar3 != 0) && (iVar3 = X509_supported_extension(ex), iVar3 == 0)) {
          pbVar2 = (byte *)((long)&x->ex_flags + 1);
          *pbVar2 = *pbVar2 | 2;
          break;
        }
        iVar17 = (int)local_38 + 1;
        local_38 = CONCAT44(local_38._4_4_,iVar17);
        iVar3 = X509_get_ext_count((X509 *)x);
      } while (iVar17 < iVar3);
    }
    pbVar2 = (byte *)((long)&x->ex_flags + 1);
    *pbVar2 = *pbVar2 | 1;
  }
  CRYPTO_MUTEX_unlock_write(lock);
LAB_0029bea5:
  return (int)(-1 < (char)x->ex_flags);
}

Assistant:

int x509v3_cache_extensions(X509 *x) {
  BASIC_CONSTRAINTS *bs;
  ASN1_BIT_STRING *usage;
  EXTENDED_KEY_USAGE *extusage;
  size_t i;
  int j;

  CRYPTO_MUTEX_lock_read(&x->lock);
  const int is_set = x->ex_flags & EXFLAG_SET;
  CRYPTO_MUTEX_unlock_read(&x->lock);

  if (is_set) {
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  CRYPTO_MUTEX_lock_write(&x->lock);
  if (x->ex_flags & EXFLAG_SET) {
    CRYPTO_MUTEX_unlock_write(&x->lock);
    return (x->ex_flags & EXFLAG_INVALID) == 0;
  }

  if (!X509_digest(x, EVP_sha256(), x->cert_hash, NULL)) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // V1 should mean no extensions ...
  if (X509_get_version(x) == X509_VERSION_1) {
    x->ex_flags |= EXFLAG_V1;
  }
  // Handle basic constraints
  if ((bs = reinterpret_cast<BASIC_CONSTRAINTS *>(
           X509_get_ext_d2i(x, NID_basic_constraints, &j, NULL)))) {
    if (bs->ca) {
      x->ex_flags |= EXFLAG_CA;
    }
    if (bs->pathlen) {
      if ((bs->pathlen->type == V_ASN1_NEG_INTEGER) || !bs->ca) {
        x->ex_flags |= EXFLAG_INVALID;
        x->ex_pathlen = 0;
      } else {
        // TODO(davidben): |ASN1_INTEGER_get| returns -1 on overflow,
        // which currently acts as if the constraint isn't present. This
        // works (an overflowing path length constraint may as well be
        // infinity), but Chromium's verifier simply treats values above
        // 255 as an error.
        x->ex_pathlen = ASN1_INTEGER_get(bs->pathlen);
      }
    } else {
      x->ex_pathlen = -1;
    }
    BASIC_CONSTRAINTS_free(bs);
    x->ex_flags |= EXFLAG_BCONS;
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Handle key usage
  if ((usage = reinterpret_cast<ASN1_BIT_STRING *>(
           X509_get_ext_d2i(x, NID_key_usage, &j, NULL)))) {
    if (usage->length > 0) {
      x->ex_kusage = usage->data[0];
      if (usage->length > 1) {
        x->ex_kusage |= usage->data[1] << 8;
      }
    } else {
      x->ex_kusage = 0;
    }
    x->ex_flags |= EXFLAG_KUSAGE;
    ASN1_BIT_STRING_free(usage);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->ex_xkusage = 0;
  if ((extusage = reinterpret_cast<EXTENDED_KEY_USAGE *>(
           X509_get_ext_d2i(x, NID_ext_key_usage, &j, NULL)))) {
    x->ex_flags |= EXFLAG_XKUSAGE;
    for (i = 0; i < sk_ASN1_OBJECT_num(extusage); i++) {
      switch (OBJ_obj2nid(sk_ASN1_OBJECT_value(extusage, i))) {
        case NID_server_auth:
          x->ex_xkusage |= XKU_SSL_SERVER;
          break;

        case NID_client_auth:
          x->ex_xkusage |= XKU_SSL_CLIENT;
          break;

        case NID_email_protect:
          x->ex_xkusage |= XKU_SMIME;
          break;

        case NID_code_sign:
          x->ex_xkusage |= XKU_CODE_SIGN;
          break;

        case NID_ms_sgc:
        case NID_ns_sgc:
          x->ex_xkusage |= XKU_SGC;
          break;

        case NID_OCSP_sign:
          x->ex_xkusage |= XKU_OCSP_SIGN;
          break;

        case NID_time_stamp:
          x->ex_xkusage |= XKU_TIMESTAMP;
          break;

        case NID_dvcs:
          x->ex_xkusage |= XKU_DVCS;
          break;

        case NID_anyExtendedKeyUsage:
          x->ex_xkusage |= XKU_ANYEKU;
          break;
      }
    }
    sk_ASN1_OBJECT_pop_free(extusage, ASN1_OBJECT_free);
  } else if (j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  x->skid = reinterpret_cast<ASN1_OCTET_STRING *>(
      X509_get_ext_d2i(x, NID_subject_key_identifier, &j, NULL));
  if (x->skid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->akid = reinterpret_cast<AUTHORITY_KEYID *>(
      X509_get_ext_d2i(x, NID_authority_key_identifier, &j, NULL));
  if (x->akid == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  // Does subject name match issuer ?
  if (!X509_NAME_cmp(X509_get_subject_name(x), X509_get_issuer_name(x))) {
    x->ex_flags |= EXFLAG_SI;
    // If SKID matches AKID also indicate self signed
    if (X509_check_akid(x, x->akid) == X509_V_OK &&
        !ku_reject(x, X509v3_KU_KEY_CERT_SIGN)) {
      x->ex_flags |= EXFLAG_SS;
    }
  }
  x->altname = reinterpret_cast<STACK_OF(GENERAL_NAME) *>(
      X509_get_ext_d2i(x, NID_subject_alt_name, &j, NULL));
  if (x->altname == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  x->nc = reinterpret_cast<NAME_CONSTRAINTS *>(
      X509_get_ext_d2i(x, NID_name_constraints, &j, NULL));
  if (x->nc == NULL && j != -1) {
    x->ex_flags |= EXFLAG_INVALID;
  }
  if (!setup_crldp(x)) {
    x->ex_flags |= EXFLAG_INVALID;
  }

  for (j = 0; j < X509_get_ext_count(x); j++) {
    const X509_EXTENSION *ex = X509_get_ext(x, j);
    if (!X509_EXTENSION_get_critical(ex)) {
      continue;
    }
    if (!X509_supported_extension(ex)) {
      x->ex_flags |= EXFLAG_CRITICAL;
      break;
    }
  }
  x->ex_flags |= EXFLAG_SET;

  CRYPTO_MUTEX_unlock_write(&x->lock);
  return (x->ex_flags & EXFLAG_INVALID) == 0;
}